

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void Js::JavascriptPromise::PerformPromiseThen
               (JavascriptPromise *sourcePromise,JavascriptPromiseCapability *capability,
               RecyclableObject *fulfillmentHandler,RecyclableObject *rejectionHandler,
               ScriptContext *scriptContext)

{
  Type TVar1;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *this;
  JavascriptLibrary *this_00;
  code *pcVar2;
  bool bVar3;
  JavascriptPromiseReaction *pJVar4;
  JavascriptPromiseReaction *reaction;
  Var pvVar5;
  undefined4 *puVar6;
  undefined1 local_40 [8];
  JavascriptPromiseReactionPair pair;
  
  pJVar4 = JavascriptPromiseReaction::New(capability,fulfillmentHandler,scriptContext);
  reaction = JavascriptPromiseReaction::New(capability,rejectionHandler,scriptContext);
  TVar1 = sourcePromise->status;
  if (TVar1 == PromiseStatusCode_HasRejection) {
    if (sourcePromise->isHandled == false) {
      this_00 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
      pvVar5 = CrossSite::MarshalVar(scriptContext,(sourcePromise->result).ptr,false);
      JavascriptLibrary::CallNativeHostPromiseRejectionTracker(this_00,sourcePromise,pvVar5,true);
    }
    pvVar5 = CrossSite::MarshalVar(scriptContext,(sourcePromise->result).ptr,false);
  }
  else {
    if (TVar1 != PromiseStatusCode_HasResolution) {
      if (TVar1 == PromiseStatusCode_Unresolved) {
        this = (sourcePromise->reactions).ptr;
        local_40 = (undefined1  [8])pJVar4;
        pair.resolveReaction = reaction;
        SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Prepend
                  (&this->
                    super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>,
                   this->allocator,(JavascriptPromiseReactionPair *)local_40);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                    ,0x5dc,"(false)","Promise status is in an invalid state");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      goto LAB_00cf0c98;
    }
    pvVar5 = CrossSite::MarshalVar(scriptContext,(sourcePromise->result).ptr,false);
    reaction = pJVar4;
  }
  EnqueuePromiseReactionTask(reaction,pvVar5,scriptContext);
LAB_00cf0c98:
  sourcePromise->isHandled = true;
  return;
}

Assistant:

void JavascriptPromise::PerformPromiseThen(
        JavascriptPromise* sourcePromise,
        JavascriptPromiseCapability* capability,
        RecyclableObject* fulfillmentHandler,
        RecyclableObject* rejectionHandler,
        ScriptContext* scriptContext)
    {
        auto* resolveReaction = JavascriptPromiseReaction::New(capability, fulfillmentHandler, scriptContext);
        auto* rejectReaction = JavascriptPromiseReaction::New(capability, rejectionHandler, scriptContext);

        switch (sourcePromise->GetStatus())
        {
        case PromiseStatusCode_Unresolved:
            JavascriptPromiseReactionPair pair;
            pair.resolveReaction = resolveReaction;
            pair.rejectReaction = rejectReaction;
            sourcePromise->reactions->Prepend(pair);
            break;

        case PromiseStatusCode_HasResolution:
            EnqueuePromiseReactionTask(
                resolveReaction, 
                CrossSite::MarshalVar(scriptContext, sourcePromise->result),
                scriptContext);
            break;

        case PromiseStatusCode_HasRejection:
        {
            if (!sourcePromise->GetIsHandled())
            {
                scriptContext->GetLibrary()->CallNativeHostPromiseRejectionTracker(
                    sourcePromise,
                    CrossSite::MarshalVar(scriptContext, sourcePromise->result),
                    true);
            }
            EnqueuePromiseReactionTask(
                rejectReaction,
                CrossSite::MarshalVar(scriptContext, sourcePromise->result),
                scriptContext);
            break;
        }

        default:
            AssertMsg(false, "Promise status is in an invalid state");
            break;
        }

        sourcePromise->SetIsHandled();
    }